

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint in_ESI;
  int i;
  int mask;
  int iVar3;
  uint uVar4;
  
  uVar4 = 0x80;
  iVar3 = 0;
  do {
    if (3 < iVar3) {
      return (stbi_uc *)CONCAT71(in_register_00000011,in_DL);
    }
    if ((in_ESI & uVar4) != 0) {
      iVar2 = stbi__at_eof((stbi__context *)CONCAT44(uVar4,iVar3));
      if (iVar2 != 0) {
        stbi__err("PIC file too short");
        return (stbi_uc *)0x0;
      }
      sVar1 = stbi__get8((stbi__context *)CONCAT44(uVar4,iVar3));
      ((stbi_uc *)CONCAT71(in_register_00000011,in_DL))[iVar3] = sVar1;
    }
    iVar3 = iVar3 + 1;
    uVar4 = (int)uVar4 >> 1;
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}